

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O0

void jhu::thrax::printRhs<true>(ostream *out,PhrasalRule *rule)

{
  AlignedSentencePair *this;
  ostream *out_00;
  char *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  Span SVar2;
  int iVar3;
  iterator pvVar4;
  iterator pvVar5;
  NT *pNVar6;
  const_reference pvVar7;
  int in_R8D;
  string_view nt_00;
  IndexType s_1;
  short local_aa;
  Span local_a8;
  short sStack_a4;
  IndexType i;
  IndexType ntStart;
  IndexType start;
  iterator nt;
  NT *it;
  Rhs nts;
  anon_class_1_0_00000001_for__M_pred empty;
  AlignedSentencePair *s;
  PhrasalRule *rule_local;
  ostream *out_local;
  
  this = rule->sentence;
  nts._M_elems[3].label._M_str._7_1_ = 0;
  memcpy(&it,rule,0x60);
  pvVar4 = std::array<jhu::thrax::NT,_4UL>::begin((array<jhu::thrax::NT,_4UL> *)&it);
  pvVar5 = std::array<jhu::thrax::NT,_4UL>::end((array<jhu::thrax::NT,_4UL> *)&it);
  pNVar6 = std::
           find_if<jhu::thrax::NT*,jhu::thrax::printRhs<true>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1_const&)_1_>
                     (pvVar4,pvVar5);
  _ntStart = std::array<jhu::thrax::NT,_4UL>::begin((array<jhu::thrax::NT,_4UL> *)&it);
  SVar2 = SpanPair::get<true>(&(rule->lhs).span);
  local_a8 = SpanPair::get<true>(&_ntStart->span);
  sStack_a4 = SVar2.start;
  for (local_aa = sStack_a4; i = SVar2.end, local_aa < i; local_aa = local_aa + 1) {
    if ((_ntStart == pNVar6) || (local_aa < local_a8.start)) {
      if (local_aa != sStack_a4) {
        std::operator<<(out,' ');
      }
      pvVar7 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&this->src,(long)local_aa);
      __str._M_len = pvVar7->_M_len;
      __str._M_str = pvVar7->_M_str;
      std::operator<<(out,__str);
    }
    else {
      if ((local_aa != sStack_a4) && (local_a8.start != sStack_a4)) {
        std::operator<<(out,' ');
      }
      out_00 = (ostream *)(_ntStart->label)._M_len;
      pcVar1 = (_ntStart->label)._M_str;
      iVar3 = PhrasalRule::ntIndex(rule,_ntStart);
      nt_00._M_str._0_4_ = iVar3;
      nt_00._M_len = (size_t)pcVar1;
      nt_00._M_str._4_4_ = 0;
      bracket((thrax *)out,out_00,nt_00,in_R8D);
      local_aa = local_a8.end + -1;
      _ntStart = _ntStart + 1;
      if (_ntStart < pNVar6) {
        local_a8 = SpanPair::get<true>(&_ntStart->span);
      }
    }
  }
  return;
}

Assistant:

inline void printRhs(std::ostream& out, const PhrasalRule& rule) {
  const auto& s = rule.sentence;
  constexpr auto empty = [](const auto& nt) { return nt.span.empty(); };
  auto nts = rule.nts;
  auto it = std::find_if(nts.begin(), nts.end(), empty);
  if constexpr (!SourceSide) {
    std::sort(
        nts.begin(),
        it,
        [](auto a, auto b) { return a.span.tgt.start < b.span.tgt.start; });
  }
  auto nt = nts.begin();
  auto [start, end] = rule.lhs.span.get<SourceSide>();
  auto [ntStart, ntEnd] = nt->span.get<SourceSide>();
  for (auto i = start; i < end; i++) {
    if (nt == it || i < ntStart) {
      if (i != start) {
        out << ' ';
      }
      if constexpr (SourceSide) {
        out << s.src[i];
      } else {
        out << s.tgt[i];
      }
    } else {
      if (i != start && ntStart != start) {
        out << ' ';
      }
      bracket(out, nt->label, rule.ntIndex(*nt));
      i = ntEnd - 1;
      nt++;
      if (nt < it) {
        auto [s, e] = nt->span.get<SourceSide>();
        ntStart = s;
        ntEnd = e;
      }
    }
  }
}